

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Minisat::Solver::relocAll(Solver *this,ClauseAllocator *to)

{
  byte bVar1;
  uint uVar2;
  vec<Minisat::Solver::Watcher,_int> *pvVar3;
  VarData *pVVar4;
  uint *puVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
  ::cleanAll(&this->watches);
  if (0 < this->next_var) {
    lVar8 = 0;
    do {
      lVar10 = 0;
      do {
        pvVar3 = (this->watches).occs.map.data;
        if (0 < pvVar3[lVar10 + lVar8 * 2].sz) {
          lVar12 = 0;
          lVar11 = 0;
          do {
            ClauseAllocator::reloc
                      (&this->ca,(CRef *)((long)&(pvVar3[lVar10 + lVar8 * 2].data)->cref + lVar12),
                       to);
            lVar11 = lVar11 + 1;
            lVar12 = lVar12 + 8;
          } while (lVar11 < pvVar3[lVar10 + lVar8 * 2].sz);
        }
        bVar13 = lVar10 == 0;
        lVar10 = lVar10 + 1;
      } while (bVar13);
      lVar8 = lVar8 + 1;
    } while (lVar8 < this->next_var);
  }
  if (0 < (this->trail).sz) {
    lVar8 = 0;
    do {
      pVVar4 = (this->vardata).
               super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.data;
      iVar6 = (this->trail).data[lVar8].x >> 1;
      uVar7 = (ulong)pVVar4[iVar6].reason;
      if ((uVar7 != 0xffffffff) &&
         ((puVar5 = (this->ca).ra.memory, (puVar5[uVar7] & 0x10) != 0 ||
          (((uVar2 = puVar5[uVar7 + 1], iVar9 = (int)uVar2 >> 1,
            bVar1 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>
                    .map.data[iVar9].value,
            ((byte)uVar2 & 1 ^ bVar1) == l_True && (l_True & 2) == 0 || (bVar1 & l_True & 2) != 0 &&
            (pVVar4[iVar9].reason != 0xffffffff)) && (pVVar4[iVar9].reason == pVVar4[iVar6].reason))
          )))) {
        ClauseAllocator::reloc(&this->ca,&pVVar4[iVar6].reason,to);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (this->trail).sz);
  }
  iVar6 = (this->learnts).sz;
  if (iVar6 < 1) {
    iVar9 = 0;
  }
  else {
    lVar10 = 0;
    lVar8 = 0;
    iVar9 = 0;
    do {
      puVar5 = (this->learnts).data;
      if (((this->ca).ra.memory[*(uint *)((long)puVar5 + lVar10)] & 3) != 1) {
        ClauseAllocator::reloc(&this->ca,(CRef *)((long)puVar5 + lVar10),to);
        puVar5 = (this->learnts).data;
        lVar11 = (long)iVar9;
        iVar9 = iVar9 + 1;
        puVar5[lVar11] = *(uint *)((long)puVar5 + lVar10);
      }
      lVar8 = lVar8 + 1;
      iVar6 = (this->learnts).sz;
      lVar10 = lVar10 + 4;
    } while (lVar8 < iVar6);
    iVar9 = (int)lVar8 - iVar9;
  }
  if (0 < iVar9) {
    (this->learnts).sz = iVar6 - iVar9;
  }
  iVar6 = (this->clauses).sz;
  if (iVar6 < 1) {
    iVar9 = 0;
  }
  else {
    lVar10 = 0;
    lVar8 = 0;
    iVar9 = 0;
    do {
      puVar5 = (this->clauses).data;
      if (((this->ca).ra.memory[*(uint *)((long)puVar5 + lVar10)] & 3) != 1) {
        ClauseAllocator::reloc(&this->ca,(CRef *)((long)puVar5 + lVar10),to);
        puVar5 = (this->clauses).data;
        lVar11 = (long)iVar9;
        iVar9 = iVar9 + 1;
        puVar5[lVar11] = *(uint *)((long)puVar5 + lVar10);
      }
      lVar8 = lVar8 + 1;
      iVar6 = (this->clauses).sz;
      lVar10 = lVar10 + 4;
    } while (lVar8 < iVar6);
    iVar9 = (int)lVar8 - iVar9;
  }
  if (0 < iVar9) {
    (this->clauses).sz = iVar6 - iVar9;
  }
  return;
}

Assistant:

void Solver::relocAll(ClauseAllocator& to)
{
    // All watchers:
    //
    watches.cleanAll();
    for (int v = 0; v < nVars(); v++)
        for (int s = 0; s < 2; s++){
            Lit p = mkLit(v, s);
            vec<Watcher>& ws = watches[p];
            for (int j = 0; j < ws.size(); j++)
                ca.reloc(ws[j].cref, to);
        }

    // All reasons:
    //
    for (int i = 0; i < trail.size(); i++){
        Var v = var(trail[i]);

        // Note: it is not safe to call 'locked()' on a relocated clause. This is why we keep
        // 'dangling' reasons here. It is safe and does not hurt.
        if (reason(v) != CRef_Undef && (ca[reason(v)].reloced() || locked(ca[reason(v)]))){
            assert(!isRemoved(reason(v)));
            ca.reloc(vardata[v].reason, to);
        }
    }

    // All learnt:
    //
    int i, j;
    for (i = j = 0; i < learnts.size(); i++)
        if (!isRemoved(learnts[i])){
            ca.reloc(learnts[i], to);
            learnts[j++] = learnts[i];
        }
    learnts.shrink(i - j);

    // All original:
    //
    for (i = j = 0; i < clauses.size(); i++)
        if (!isRemoved(clauses[i])){
            ca.reloc(clauses[i], to);
            clauses[j++] = clauses[i];
        }
    clauses.shrink(i - j);
}